

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsVarDeserializer(void *data,size_t size,ReadHostObjectFunc readHostObject,
                 GetSharedArrayBufferFromIdFunc getSharedArrayBufferFromId,void *callbackState,
                 JsVarDeserializerHandle *deserializerHandle)

{
  anon_class_48_6_968a2487 fn;
  JsVarDeserializerHandle *local_40;
  JsVarDeserializerHandle *deserializerHandle_local;
  void *callbackState_local;
  GetSharedArrayBufferFromIdFunc getSharedArrayBufferFromId_local;
  ReadHostObjectFunc readHostObject_local;
  size_t size_local;
  void *data_local;
  
  if (data == (void *)0x0) {
    data_local._4_4_ = JsErrorNullArgument;
  }
  else if (readHostObject == (ReadHostObjectFunc)0x0) {
    data_local._4_4_ = JsErrorNullArgument;
  }
  else if (getSharedArrayBufferFromId == (GetSharedArrayBufferFromIdFunc)0x0) {
    data_local._4_4_ = JsErrorNullArgument;
  }
  else if (deserializerHandle == (JsVarDeserializerHandle *)0x0) {
    data_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.getSharedArrayBufferFromId = (GetSharedArrayBufferFromIdFunc *)&callbackState_local;
    fn.readHostObject = (ReadHostObjectFunc *)&getSharedArrayBufferFromId_local;
    fn.callbackState = &deserializerHandle_local;
    fn.data = (void **)&size_local;
    fn.size = (size_t *)&readHostObject_local;
    fn.deserializerHandle = &local_40;
    local_40 = deserializerHandle;
    deserializerHandle_local = (JsVarDeserializerHandle *)callbackState;
    callbackState_local = getSharedArrayBufferFromId;
    getSharedArrayBufferFromId_local = (GetSharedArrayBufferFromIdFunc)readHostObject;
    readHostObject_local = (ReadHostObjectFunc)size;
    size_local = (size_t)data;
    data_local._4_4_ = ContextAPINoScriptWrapper_NoRecord<JsVarDeserializer::__0>(fn,false,false);
  }
  return data_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarDeserializer(
    _In_ void *data,
    _In_ size_t size,
    _In_ ReadHostObjectFunc readHostObject,
    _In_ GetSharedArrayBufferFromIdFunc getSharedArrayBufferFromId,
    _In_opt_ void* callbackState,
    _Out_ JsVarDeserializerHandle *deserializerHandle)
{
    PARAM_NOT_NULL(data);
    PARAM_NOT_NULL(readHostObject);
    PARAM_NOT_NULL(getSharedArrayBufferFromId);
    PARAM_NOT_NULL(deserializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle *reader = HeapNew(ChakraHostDeserializerHandle, readHostObject, getSharedArrayBufferFromId, callbackState);
        reader->SetDeserializer(HeapNew(Js::SCACore::Deserializer, data, size, scriptContext, reader));
        *deserializerHandle = reader;
        return JsNoError;
    });
}